

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::GetDefaultBlindingKeyRequest::GetDefaultBlindingKeyRequest
          (GetDefaultBlindingKeyRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::GetDefaultBlindingKeyRequest>)._vptr_JsonClassBase
       = (_func_int **)&PTR__GetDefaultBlindingKeyRequest_00a92c90;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->master_blinding_key_)._M_dataplus._M_p = (pointer)&(this->master_blinding_key_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->master_blinding_key_,"");
  (this->locking_script_)._M_dataplus._M_p = (pointer)&(this->locking_script_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->locking_script_,"");
  (this->address_)._M_dataplus._M_p = (pointer)&(this->address_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  CollectFieldName();
  return;
}

Assistant:

GetDefaultBlindingKeyRequest() {
    CollectFieldName();
  }